

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *this;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *p_Var1;
  size_t sVar2;
  TableType type_00;
  bool bVar3;
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *p_Var4;
  undefined4 *puVar5;
  string *this_00;
  ImportNames *import_00;
  uint64_t uVar6;
  ImportNames *exports_00;
  Type addressType;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  Name name;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  undefined1 local_170 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  undefined3 uStack_12f;
  undefined1 local_120 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  MaybeResult<wasm::Ok> type;
  optional<unsigned_int> elems;
  char *local_a8;
  size_t local_a0;
  undefined3 local_98;
  undefined1 uStack_95;
  undefined3 uStack_94;
  unsigned_long local_90;
  undefined1 local_88 [8];
  Result<wasm::WATParser::TableType> _val_3;
  MaybeResult<wasm::Ok> _val_2;
  
  sVar2 = (ctx->in).pos;
  expected._M_str = "table";
  expected._M_len = 5;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_170,&ctx->in);
  if (exports.val.
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
      _M_storage[8] == '\0') {
    local_a8 = (char *)0x0;
    local_a0 = 0;
  }
  else {
    local_a8 = (char *)exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
    local_a0 = (size_t)local_170;
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_170,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_120,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_170);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),(string *)local_120);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_120);
    goto LAB_00c051d6;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_120);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_120,&ctx->in);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             ((long)&import.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20),(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
                   local_120);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
               (string *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20));
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
    addressType.id = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar3 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar3) {
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(&ctx->in,expected_01);
      addressType.id = 2;
    }
    maybeReftype<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<wasm::Ok> *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&import.val.
                            super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                    + 0x20));
    if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)local_88,
                 (string *)
                 ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_88);
      std::__cxx11::string::~string((string *)local_88);
LAB_00c04e96:
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
      type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._36_1_ = 0;
      _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ =
           type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_;
      if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
        tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::WATParser::TableType> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),ctx
                   ,addressType);
        this = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)local_88,
                        (_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)this);
        if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
            _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          std::__cxx11::string::string((string *)&elems,(string *)local_88);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,&elems);
          std::__cxx11::string::~string((string *)&elems);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_88);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            ((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_88);
          p_Var4 = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)0x0;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var4 = this;
          }
          uVar6 = (p_Var4->_M_u)._M_first._M_storage.limits.initial;
          local_90 = (p_Var4->_M_u)._M_first._M_storage.limits.max.
                     super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index =
               *(__index_type *)((long)&p_Var4->_M_u + 0x18);
          puVar5 = (undefined4 *)&DAT_00000019;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            puVar5 = (undefined4 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x11);
          }
          local_98 = (undefined3)*puVar5;
          uStack_95 = (undefined1)*(undefined4 *)((long)puVar5 + 3);
          uStack_94 = (undefined3)((uint)*(undefined4 *)((long)puVar5 + 3) >> 8);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage(this);
          addressType.id =
               _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
LAB_00c05046:
          bVar3 = Lexer::takeRParen(&ctx->in);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,"expected end of table declaration",
                       (allocator<char> *)local_88);
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_190);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            this_00 = &local_190;
            goto LAB_00c051b9;
          }
          exports_00 = (ImportNames *)local_170;
          if (exports.val.
              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
              super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0')
          {
            exports_00 = (ImportNames *)0x0;
          }
          import_00 = (ImportNames *)local_120;
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ != '\0') {
            import_00 = (ImportNames *)0x0;
          }
          type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._13_3_ = uStack_94;
          type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._12_1_ = uStack_95;
          uStack_12f = (undefined3)_local_98;
          type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._9_3_ = uStack_12f;
          type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged =
               (bool)_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index;
          type_00.limits.initial = uVar6;
          type_00.addressType.id = addressType.id;
          type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_90;
          name.super_IString.str._M_str = local_a8;
          name.super_IString.str._M_len = local_a0;
          exports.val.
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = addressType.id;
          ParseDeclsCtx::addTable
                    ((Result<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
                     ctx,name,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)exports_00,
                     import_00,type_00,(Index)sVar2);
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string
                      ((string *)local_88,
                       (string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,local_88);
LAB_00c05114:
            std::__cxx11::string::~string((string *)local_88);
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20));
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20));
            if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ != '\x01') {
              ParseDeclsCtx::addImplicitElems
                        ((__index_type *)
                         ((long)&_val_3.val.
                                 super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                         0x20),ctx,
                         (__index_type *)
                         ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                  '\x01') {
                std::__cxx11::string::string
                          ((string *)local_88,
                           (string *)
                           ((long)&_val_3.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                           0x20));
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                _Variant_storage<2ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                           __return_storage_ptr__,local_88);
                goto LAB_00c05114;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
            }
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
          }
        }
      }
      else {
        expected_02._M_str = "elem";
        expected_02._M_len = 4;
        bVar3 = Lexer::takeSExprStart(&ctx->in,expected_02);
        if (bVar3) {
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ == '\x01') {
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_3_ = 0;
            p_Var1 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
            bVar3 = false;
            while (maybeElemexpr<wasm::WATParser::ParseDeclsCtx>
                             ((MaybeResult<wasm::Ok> *)p_Var1,ctx),
                  _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88,
                              (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var1);
              if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
                  _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged == true) {
                std::__cxx11::string::string((string *)&elems,(string *)local_88);
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                _Variant_storage<2ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                           __return_storage_ptr__,&elems);
                goto LAB_00c05380;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88
                               );
              _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ + 1;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage(p_Var1);
              bVar3 = true;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              ((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20));
            if (!bVar3) {
              p_Var1 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
              ;
LAB_00c0528f:
              maybeFuncidx<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)p_Var1,ctx);
              if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
                std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88,
                                (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var1);
                if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                    _M_first._M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged != true)
                goto code_r0x00c052b6;
                std::__cxx11::string::string((string *)&elems,(string *)local_88);
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                _Variant_storage<2ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                           __return_storage_ptr__,&elems);
LAB_00c05380:
                std::__cxx11::string::~string((string *)&elems);
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                  local_88);
                goto LAB_00c04e96;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
            }
            bVar3 = Lexer::takeRParen(&ctx->in);
            if (bVar3) {
              uVar6 = (uint64_t)
                      (uint)_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_;
              type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ =
                   uVar6 | 0x100000000;
              _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x01';
              local_90 = uVar6;
              goto LAB_00c05046;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"expected end of inline elems",
                       (allocator<char> *)local_88);
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_1b0);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            this_00 = &local_1b0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"imported tables cannot have inline elements",
                       (allocator<char> *)local_88);
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_1d0);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
            this_00 = &local_1d0;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"expected table limits or inline elements",
                     (allocator<char> *)local_88);
          Lexer::err((Err *)((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20),&ctx->in,&local_1f0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20))
          ;
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20));
          this_00 = &local_1f0;
        }
LAB_00c051b9:
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&import.val.
                              super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                      + 0x20));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_120);
LAB_00c051d6:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_170);
  return __return_storage_ptr__;
code_r0x00c052b6:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
  _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ =
       _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ + 1;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage(p_Var1);
  goto LAB_00c0528f;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}